

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

RC __thiscall
QO_Manager::ApplyGTCond
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attr_stats,int condIdx,float *numTuples)

{
  float fVar1;
  float fVar2;
  float fVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float local_68;
  float fracR_1;
  float value;
  float newMinS;
  float newMaxR;
  float local_54;
  float local_50;
  float fracR;
  float local_48;
  float local_44;
  float fracS;
  float mid;
  float frac;
  int idx2;
  int idx;
  RC rc;
  float *numTuples_local;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> *pmStack_20;
  int condIdx_local;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
  *attr_stats_local;
  QO_Manager *this_local;
  
  idx2 = 0;
  _idx = numTuples;
  numTuples_local._4_4_ = condIdx;
  pmStack_20 = attr_stats;
  attr_stats_local =
       (map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> *)this;
  idx2 = CondToAttrIdx(this,condIdx,(int *)&frac,(int *)&mid);
  this_local._4_4_ = idx2;
  if (idx2 == 0) {
    fracS = 0.0;
    if (this->conds[numTuples_local._4_4_].bRhsIsAttr == 0) {
      ConvertValueToFloat(this,numTuples_local._4_4_,&local_68);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar7 = pmVar4->maxValue - local_68;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar1 = pmVar4->maxValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar7 = (fVar7 + 1.0) / ((fVar1 - pmVar4->minValue) + 2.0);
      *_idx = *_idx * fVar7;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar1 = pmVar4->numTuples;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar4->numTuples = fVar1 * fVar7;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar4->minValue = local_68;
      fracS = fVar7;
    }
    else {
      std::swap<int>((int *)&frac,(int *)&mid);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      pfVar6 = std::min<float>(&pmVar4->maxValue,&pmVar5->maxValue);
      fVar1 = *pfVar6;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      pfVar6 = std::max<float>(&pmVar4->minValue,&pmVar5->minValue);
      local_44 = (fVar1 + *pfVar6) * 0.5;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      fracR = (pmVar4->maxValue - local_44) + 1.0;
      local_50 = 0.0;
      pfVar6 = std::max<float>(&fracR,&local_50);
      fVar1 = *pfVar6;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      fVar7 = pmVar4->maxValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      fVar2 = local_44;
      local_48 = fVar1 / ((fVar7 - pmVar4->minValue) + 1.0);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      newMaxR = (fVar2 - pmVar4->minValue) + 1.0;
      newMinS = 0.0;
      pfVar6 = std::max<float>(&newMaxR,&newMinS);
      fVar1 = *pfVar6;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar7 = pmVar4->maxValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      local_54 = fVar1 / ((fVar7 - pmVar4->minValue) + 1.0);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      pfVar6 = std::min<float>(&pmVar4->maxValue,&pmVar5->maxValue);
      value = *pfVar6;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      pfVar6 = std::min<float>(&pmVar4->minValue,&pmVar5->minValue);
      fracR_1 = *pfVar6;
      fVar1 = *_idx;
      pfVar6 = std::max<float>(&local_54,&local_48);
      *_idx = fVar1 * *pfVar6;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar8 = value;
      fVar1 = pmVar4->numTuples;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar7 = pmVar4->minValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar2 = pmVar4->maxValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar3 = pmVar4->minValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar4->numTuples = (fVar1 * ((fVar8 - fVar7) + 1.0)) / ((fVar2 - fVar3) + 2.0);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar1 = pmVar4->numTuples;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      fVar8 = pmVar4->maxValue - fracR_1;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      fVar7 = pmVar4->maxValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      fVar2 = pmVar4->minValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&mid);
      fVar3 = value;
      pmVar4->numTuples = (fVar1 * fVar8) / ((fVar7 - fVar2) + 2.0);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      fVar1 = fracR_1;
      pmVar4->maxValue = fVar3;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](pmStack_20,(key_type *)&frac);
      pmVar4->minValue = fVar1;
      pfVar6 = std::max<float>(&local_54,&local_48);
      fracS = *pfVar6;
    }
    NormalizeStats(this,pmStack_20,fracS,*_idx,(int)frac,(int)mid);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC QO_Manager::ApplyGTCond(map<int, attrStat> &attr_stats, int condIdx, float& numTuples){
  RC rc = 0;
  // Retrieves the indices of the condition attributes
  int idx, idx2;
  if((rc = CondToAttrIdx(condIdx, idx, idx2)))
    return (rc);
  float frac = 0.0;
  if(conds[condIdx].bRhsIsAttr){
    swap(idx, idx2); // the following is the same as LT, except attr indices are swapped
    float mid = 0.5*(min(attr_stats[idx].maxValue, attr_stats[idx2].maxValue) + 
      max(attr_stats[idx].minValue, attr_stats[idx2].minValue));
    float fracS = max(attr_stats[idx2].maxValue - mid + 1, (float)0.0) / 
      (attr_stats[idx2].maxValue - attr_stats[idx2].minValue + 1);
    float fracR = max(mid - attr_stats[idx].minValue + 1, (float)0.0) / 
      (attr_stats[idx].maxValue - attr_stats[idx].minValue + 1);
    float newMaxR = min(attr_stats[idx].maxValue, attr_stats[idx2].maxValue);
    float newMinS = min(attr_stats[idx].minValue, attr_stats[idx2].minValue);
    numTuples = numTuples * max(fracR, fracS);
    attr_stats[idx].numTuples = attr_stats[idx].numTuples*(newMaxR - attr_stats[idx].minValue + 1)/
      (attr_stats[idx].maxValue - attr_stats[idx].minValue + 2);
    attr_stats[idx2].numTuples = attr_stats[idx].numTuples*(attr_stats[idx2].maxValue - newMinS)/
      (attr_stats[idx2].maxValue - attr_stats[idx2].minValue + 2);
    attr_stats[idx].maxValue = newMaxR;
    attr_stats[idx].minValue = newMinS;
    frac = max(fracR, fracS);
  }
  else{
    float value;
    ConvertValueToFloat(condIdx, value); // get the min value
    // calculate the fraction of values expected to survive the condition. assume
    // that values for relation are evenly distributed
    float fracR = (attr_stats[idx].maxValue - value + 1)/(attr_stats[idx].maxValue - attr_stats[idx].minValue + 2);
    // update values
    numTuples = numTuples*fracR; 
    attr_stats[idx].numTuples = attr_stats[idx].numTuples * fracR;
    attr_stats[idx].minValue = value;
    frac = fracR;
  }
  // Normalize non-join attributes
  NormalizeStats(attr_stats, frac, numTuples, idx, idx2);
  return (0);
}